

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNDstrBase::adjust_for_dyn(CTPNDstrBase *this,tcpn_dyncomp_info *info)

{
  CTcPrsNode *len;
  long in_RSI;
  char *in_RDI;
  CTPNDebugDstr *in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RSI + 4) != 0) {
    err_throw(0);
  }
  len = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x25ad47);
  CTPNDebugDstr::CTPNDebugDstr(in_stack_ffffffffffffffe0,in_RDI,(size_t)len);
  return len;
}

Assistant:

CTcPrsNode *CTPNDstrBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* 
     *   don't allow dstring evaluation in speculative mode, since we
     *   can't execute anything with side effects in this mode 
     */
    if (info->speculative)
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* return a debugger dstring node */
    return new CTPNDebugDstr(str_, len_);
}